

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

int fy_parser_reset(fy_parser *fyp)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if (fyp != (fy_parser *)0x0) {
    fy_parse_input_reset(fyp);
    fy_input_unref(fyp->current_input);
    fyp->current_input_pos = 0;
    fyp->current_ptr = (void *)0x0;
    fyp->current_input = (fy_input *)0x0;
    fyp->current_pos = 0;
    fyp->current_c = -1;
    iVar3 = 0;
    fyp->nontab_column = 0;
    fyp->next_single_document = false;
    *(undefined8 *)&fyp->current_w = 0;
    *(undefined8 *)((long)&fyp->current_left + 4) = 0;
    fyp->column = 0;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xf80f;
    if (fyp->diag == (fy_diag *)0x0) {
      __assert_fail("fyp->diag",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                    ,0x144c,"int fy_parser_reset(struct fy_parser *)");
    }
    puVar1 = &fyp->diag->field_0x3c;
    *puVar1 = *puVar1 & 0xfe;
    iVar2 = fy_reset_document_state(fyp);
    if (iVar2 != 0) {
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x1451,"fy_parser_reset","fy_parse_input_reset() failed");
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int fy_parser_reset(struct fy_parser *fyp) {
    int rc;

    if (!fyp)
        return -1;

    fy_parse_input_reset(fyp);

    fy_input_unref(fyp->current_input);

    fyp->current_input = NULL;
    fyp->current_pos = 0;
    fyp->current_input_pos = 0;
    fyp->current_ptr = NULL;
    fyp->current_c = -1;
    fyp->current_w = 0;
    fyp->current_left = 0;
    fyp->line = 0;
    fyp->column = 0;
    fyp->nontab_column = 0;

    fyp->next_single_document = false;
    fyp->stream_error = false;
    fyp->generated_block_map = false;
    fyp->last_was_comma = false;
    fyp->document_has_content = false;
    fyp->document_first_content_token = false;
    fyp->bare_document_only = false;
    fyp->stream_has_content = false;

    assert(fyp->diag);
    fyp->diag->on_error = false;

    rc = fy_reset_document_state(fyp);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_parse_input_reset() failed");

    return 0;
    err_out_rc:
    return rc;
}